

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

void uv__wait_children(uv_loop_t *loop)

{
  uv__queue **ppuVar1;
  uint uVar2;
  uv__queue *puVar3;
  uv__queue *puVar4;
  uv__queue *puVar5;
  uv__queue *puVar6;
  __pid_t _Var7;
  int *piVar8;
  uint uVar9;
  uv__queue *puVar10;
  int status;
  uv__queue pending;
  int local_44;
  uv__queue local_40;
  
  puVar10 = (loop->process_handles).next;
  puVar4 = &local_40;
  puVar5 = &local_40;
  puVar6 = &local_40;
  if (puVar10 != &loop->process_handles) {
    local_40.next = &local_40;
    local_40.prev = &local_40;
    do {
      puVar3 = puVar10->next;
      do {
        _Var7 = waitpid(*(__pid_t *)&puVar10[-1].prev,&local_44,1);
        if (_Var7 != -1) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      if (_Var7 != 0) {
        if (_Var7 == -1) {
          piVar8 = __errno_location();
          if (*piVar8 != 10) {
            abort();
          }
        }
        else {
          if (_Var7 != *(int *)&puVar10[-1].prev) {
            __assert_fail("pid == process->pid",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/process.c"
                          ,0xa0,"void uv__wait_children(uv_loop_t *)");
          }
          *(undefined4 *)&puVar10[-1].prev = 0;
          *(int *)&puVar10[1].next = local_44;
          puVar10->prev->next = puVar10->next;
          puVar10->next->prev = puVar10->prev;
          puVar10->next = &local_40;
          puVar10->prev = local_40.prev;
          (local_40.prev)->next = puVar10;
          local_40.prev = puVar10;
        }
      }
      puVar10 = puVar3;
      puVar4 = local_40.next;
      puVar5 = local_40.next;
      puVar6 = local_40.prev;
    } while (puVar3 != &loop->process_handles);
  }
  while (puVar10 = puVar4, local_40.next = puVar5, local_40.prev = puVar6, puVar10 != &local_40) {
    puVar4 = puVar10->next;
    puVar10->prev->next = puVar4;
    puVar10->next->prev = puVar10->prev;
    puVar10->next = puVar10;
    puVar10->prev = puVar10;
    uVar2 = *(uint *)&puVar10[-2].prev;
    if (((uVar2 & 4) != 0) && (*(uint *)&puVar10[-2].prev = uVar2 & 0xfffffffb, (uVar2 & 8) != 0)) {
      ppuVar1 = &(puVar10[-5].prev)->prev;
      *(int *)ppuVar1 = *(int *)ppuVar1 + -1;
    }
    if (puVar10[-1].next != (uv__queue *)0x0) {
      uVar9 = *(uint *)&puVar10[1].next & 0x7f;
      uVar2 = *(uint *)&puVar10[1].next >> 8 & 0xff;
      if (uVar9 != 0) {
        uVar2 = 0;
      }
      if ((int)(uVar9 * 0x1000000 + 0x1000000) < 0x2000000) {
        uVar9 = 0;
      }
      (*(code *)puVar10[-1].next)(puVar10 + -5,uVar2,uVar9);
      puVar5 = local_40.next;
      puVar6 = local_40.prev;
    }
  }
  if (puVar5 != &local_40) {
    __assert_fail("uv__queue_empty(&pending)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/process.c"
                  ,0xbe,"void uv__wait_children(uv_loop_t *)");
  }
  return;
}

Assistant:

void uv__wait_children(uv_loop_t* loop) {
  uv_process_t* process;
  int exit_status;
  int term_signal;
  int status;
  int options;
  pid_t pid;
  struct uv__queue pending;
  struct uv__queue* q;
  struct uv__queue* h;

  uv__queue_init(&pending);

  h = &loop->process_handles;
  q = uv__queue_head(h);
  while (q != h) {
    process = uv__queue_data(q, uv_process_t, queue);
    q = uv__queue_next(q);

#ifndef UV_USE_SIGCHLD
    if ((process->flags & UV_HANDLE_REAP) == 0)
      continue;
    options = 0;
    process->flags &= ~UV_HANDLE_REAP;
    loop->nfds--;
#else
    options = WNOHANG;
#endif

    do
      pid = waitpid(process->pid, &status, options);
    while (pid == -1 && errno == EINTR);

#ifdef UV_USE_SIGCHLD
    if (pid == 0) /* Not yet exited */
      continue;
#endif

    if (pid == -1) {
      if (errno != ECHILD)
        abort();
      /* The child died, and we missed it. This probably means someone else
       * stole the waitpid from us. Handle this by not handling it at all. */
      continue;
    }

    assert(pid == process->pid);
    process->pid = 0; // pid is no longer valid (or unique)
    process->status = status;
    uv__queue_remove(&process->queue);
    uv__queue_insert_tail(&pending, &process->queue);
  }

  h = &pending;
  q = uv__queue_head(h);
  while (q != h) {
    process = uv__queue_data(q, uv_process_t, queue);
    q = uv__queue_next(q);

    uv__queue_remove(&process->queue);
    uv__queue_init(&process->queue);
    uv__handle_stop(process);

    if (process->exit_cb == NULL)
      continue;

    exit_status = 0;
    if (WIFEXITED(process->status))
      exit_status = WEXITSTATUS(process->status);

    term_signal = 0;
    if (WIFSIGNALED(process->status))
      term_signal = WTERMSIG(process->status);

    process->exit_cb(process, exit_status, term_signal);
  }
  assert(uv__queue_empty(&pending));
}